

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

char * __thiscall
CVmDateLocale::index_list(CVmDateLocale *this,size_t *itemlen,int item,int idx,int sticky)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  bool bVar6;
  size_t local_20;
  
  pcVar2 = get(this,&local_20,item);
  if (pcVar2 == (char *)0x0) {
LAB_00289e73:
    *itemlen = 0;
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar3 = pcVar2;
    if (local_20 != 0 && 0 < idx) {
      do {
        lVar4 = 1 - local_20;
        pcVar1 = pcVar3;
LAB_00289de7:
        pcVar2 = pcVar1 + 1;
        if (*pcVar1 == '\0') goto LAB_00289e29;
        if (*pcVar1 != ',') goto code_r0x00289df4;
        local_20 = -lVar4;
      } while ((1 < idx) && (idx = idx + -1, pcVar3 = pcVar2, lVar4 != 0));
      local_20 = -lVar4;
    }
LAB_00289e2d:
    *itemlen = 0;
    if (local_20 != 0) {
      sVar5 = 1;
      do {
        if (pcVar2[sVar5 - 1] == ',') {
          return pcVar2;
        }
        if (pcVar2[sVar5 - 1] == '=') {
          return pcVar2;
        }
        *itemlen = sVar5;
        bVar6 = sVar5 != local_20;
        sVar5 = sVar5 + 1;
      } while (bVar6);
    }
  }
  return pcVar2;
code_r0x00289df4:
  lVar4 = lVar4 + 1;
  pcVar1 = pcVar2;
  if (lVar4 == 1) {
LAB_00289e29:
    pcVar2 = pcVar3;
    if (sticky != 0) goto LAB_00289e2d;
    goto LAB_00289e73;
  }
  goto LAB_00289de7;
}

Assistant:

const char *index_list(VMG_ size_t &itemlen, int item, int idx, int sticky)
    {
        /* get the item */
        size_t len;
        const char *str = get(vmg_ len, item);

        /* if we didn't find it, return failure */
        if (str == 0)
        {
            itemlen = 0;
            return 0;
        }

        /* skip items (delimited by commas) until we reach the target index */
        for ( ; idx > 0 && len != 0 ; --idx, ++str, --len)
        {
            /* find the next comma */
            const char *comma = lib_strnchr(str, len, ',');
            if (comma == 0)
            {
                /* 
                 *   No more commas, so the index is past the end of the
                 *   list.  If 'sticky' is true, use the last item; otherwise
                 *   return "not found".
                 */
                if (sticky)
                    break;
                else
                {
                    itemlen = 0;
                    return 0;
                }
            }
            
            /* advance to the comma */
            len -= comma - str;
            str = comma;
        }
        
        /* we have the item; measure its length, up to the next '=' or ',' */
        const char *p;
        for (p = str, itemlen = 0 ; len != 0 && *p != '=' && *p != ',' ;
             --len, ++p, ++itemlen) ;
        
        /* return the item pointer */
        return str;
    }